

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void icetMatrixRotate(IceTDouble angle,IceTDouble x,IceTDouble y,IceTDouble z,IceTDouble *mat_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  IceTDouble s;
  IceTDouble c;
  IceTDouble length;
  IceTDouble v [3];
  IceTDouble *mat_out_local;
  IceTDouble z_local;
  IceTDouble y_local;
  IceTDouble x_local;
  IceTDouble angle_local;
  
  dVar1 = sqrt((double)z * (double)z + (double)x * (double)x + (double)y * (double)y);
  dVar2 = (double)x / dVar1;
  dVar3 = (double)y / dVar1;
  dVar1 = (double)z / dVar1;
  dVar4 = cos((double)angle * 0.017453292519943295);
  dVar5 = sin((double)angle * 0.017453292519943295);
  *mat_out = (IceTDouble)(dVar2 * dVar2 * (1.0 - dVar4) + dVar4);
  mat_out[1] = (IceTDouble)(dVar2 * dVar3 * (1.0 - dVar4) + dVar1 * dVar5);
  mat_out[2] = (IceTDouble)(dVar2 * dVar1 * (1.0 - dVar4) + -(dVar3 * dVar5));
  mat_out[3] = 0.0;
  mat_out[4] = (IceTDouble)(dVar2 * dVar3 * (1.0 - dVar4) + -(dVar1 * dVar5));
  mat_out[5] = (IceTDouble)(dVar3 * dVar3 * (1.0 - dVar4) + dVar4);
  mat_out[6] = (IceTDouble)(dVar3 * dVar1 * (1.0 - dVar4) + dVar2 * dVar5);
  mat_out[7] = 0.0;
  mat_out[8] = (IceTDouble)(dVar2 * dVar1 * (1.0 - dVar4) + dVar3 * dVar5);
  mat_out[9] = (IceTDouble)(dVar3 * dVar1 * (1.0 - dVar4) + -(dVar2 * dVar5));
  mat_out[10] = (IceTDouble)(dVar1 * dVar1 * (1.0 - dVar4) + dVar4);
  mat_out[0xb] = 0.0;
  mat_out[0xc] = 0.0;
  mat_out[0xd] = 0.0;
  mat_out[0xe] = 0.0;
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixRotate(IceTDouble angle,
                                  IceTDouble x, IceTDouble y, IceTDouble z,
                                  IceTDouble *mat_out)
{
    IceTDouble v[3];
    IceTDouble length;
    IceTDouble c;
    IceTDouble s;

    v[0] = x;  v[1] = y;  v[2] = z;
    length = sqrt(icetDot3(v, v));
    v[0] /= length;  v[1] /= length;  v[2] /= length;

    c = cos((M_PI/180.0)*angle);
    s = sin((M_PI/180.0)*angle);

    mat_out[ 0] = v[0]*v[0]*(1-c) + c;
    mat_out[ 1] = v[0]*v[1]*(1-c) + v[2]*s;
    mat_out[ 2] = v[0]*v[2]*(1-c) - v[1]*s;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = v[0]*v[1]*(1-c) - v[2]*s;
    mat_out[ 5] = v[1]*v[1]*(1-c) + c;
    mat_out[ 6] = v[1]*v[2]*(1-c) + v[0]*s;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = v[0]*v[2]*(1-c) + v[1]*s;
    mat_out[ 9] = v[1]*v[2]*(1-c) - v[0]*s;
    mat_out[10] = v[2]*v[2]*(1-c) + c;
    mat_out[11] = 0.0;

    mat_out[12] = 0.0;
    mat_out[13] = 0.0;
    mat_out[14] = 0.0;
    mat_out[15] = 1.0;
}